

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.h
# Opt level: O0

void __thiscall Liby::io_task::~io_task(io_task *this)

{
  io_task *this_local;
  
  std::unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>::
  ~unique_ptr(&this->handler_);
  std::shared_ptr<Liby::Buffer>::~shared_ptr(&this->buffer_);
  std::shared_ptr<Liby::FileDescriptor>::~shared_ptr(&this->fp_);
  return;
}

Assistant:

io_task() = default;